

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  socklen_t sinLength;
  sockaddr_in sin;
  
  sinLength = 0x10;
  iVar1 = getsockname(socket,(sockaddr *)&sin,&sinLength);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    address->host = sin.sin_addr.s_addr;
    address->port = sin.sin_port << 8 | sin.sin_port >> 8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
enet_socket_get_address (ENetSocket socket, ENetAddress * address)
{
    struct sockaddr_in sin;
    socklen_t sinLength = sizeof (struct sockaddr_in);

    if (getsockname (socket, (struct sockaddr *) & sin, & sinLength) == -1)
      return -1;

    address -> host = (enet_uint32) sin.sin_addr.s_addr;
    address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);

    return 0;
}